

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.hpp
# Opt level: O3

int __thiscall
sjtu::DynamicFileManager<sjtu::trainType>::init
          (DynamicFileManager<sjtu::trainType> *this,EVP_PKEY_CTX *ctx)

{
  fstream *pfVar1;
  byte bVar2;
  int iVar3;
  LRUCache<sjtu::trainType> *pLVar4;
  Node *pNVar5;
  byte in_CL;
  uint in_EDX;
  locType loc;
  ofstream outfile;
  ifstream infile;
  trainType tmp;
  undefined8 local_abe0;
  long local_abd8;
  filebuf local_abd0 [240];
  ios_base local_aae0 [264];
  undefined1 local_a9d8 [520];
  undefined1 local_a7d0 [42856];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pLVar4 = (this->super_FileManager_Base<sjtu::trainType>).cache;
  if (pLVar4 != (LRUCache<sjtu::trainType> *)0x0) {
    LRUCache<sjtu::trainType>::~LRUCache(pLVar4);
    operator_delete(pLVar4,0x48);
  }
  pLVar4 = (LRUCache<sjtu::trainType> *)operator_new(0x48);
  pfVar1 = &(this->super_FileManager_Base<sjtu::trainType>).file;
  pLVar4->file = pfVar1;
  pLVar4->block_lim = (ulong)in_EDX;
  pLVar4->attempt_count = 0;
  pLVar4->miss_count = 0;
  pLVar4->head = (CacheNode *)0x0;
  pLVar4->tail = (CacheNode *)0x0;
  pNVar5 = (Node *)operator_new(0x28);
  pNVar5->value = (value_type *)0x0;
  pNVar5->color = BLACK;
  (pLVar4->table).nil = pNVar5;
  (pLVar4->table).nodebegin = pNVar5;
  pNVar5->right = pNVar5;
  pNVar5->left = pNVar5;
  pNVar5->parent = pNVar5;
  (pLVar4->table).tot = 0;
  (this->super_FileManager_Base<sjtu::trainType>).cache = pLVar4;
  std::ifstream::ifstream(local_a9d8,(string *)ctx,_S_in);
  bVar2 = std::__basic_file<char>::is_open();
  if ((byte)(bVar2 ^ 1 | in_CL) == 1) {
    (this->super_FileManager_Base<sjtu::trainType>).is_newfile = true;
    std::ofstream::ofstream(&local_abd8,(string *)ctx,_S_out|_S_bin);
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    std::ostream::write((char *)&local_abd8,(long)local_a7d0);
    local_abe0 = 0xa7a8;
    std::ostream::seekp((long)&local_abd8,0xffff5858);
    std::ostream::write((char *)&local_abd8,(long)&local_abe0);
    std::ofstream::close();
    local_abd8 = _VTT;
    *(undefined8 *)(local_abd0 + *(long *)(_VTT + -0x18) + -8) = _tellp;
    std::filebuf::~filebuf(local_abd0);
    std::ios_base::~ios_base(local_aae0);
  }
  else {
    (this->super_FileManager_Base<sjtu::trainType>).is_newfile = false;
  }
  std::ifstream::close();
  std::fstream::open((string *)pfVar1,(_Ios_Openmode)ctx);
  iVar3 = std::ifstream::~ifstream(local_a9d8);
  return iVar3;
}

Assistant:

virtual void init(std::string filepath , unsigned int cache_size , bool is_reset = false) override
		{
			if (cache) delete cache;
			cache = new LRUCache<T>(cache_size , file);
			std::ifstream infile(filepath , std::ios_base::in);
			if (!infile.is_open() || is_reset)
			{
				is_newfile = true;
				std::ofstream outfile(filepath , std::ios_base::out | std::ios_base::binary);
				T tmp;
				outfile.write(reinterpret_cast<char *> (&tmp) , sizeof (T));
				locType loc = sizeof (T);
				outfile.seekp(- sizeof (T) , std::ios_base::cur) , outfile.write(reinterpret_cast<char *> (&loc) , sizeof (locType));
				outfile.close();
			}else is_newfile = false;
			infile.close();
			file.open(filepath , std::ios_base::in | std::ios_base::out | std::ios_base::binary);
		}